

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cpp
# Opt level: O2

void add_histogram(void *b_,ReduceProxy *srp)

{
  pointer pBVar1;
  mapped_type *bb;
  int i;
  long lVar2;
  Histogram histogram;
  BlockID local_50;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  receive_histogram(b_,srp,(Histogram *)&local_48);
  for (lVar2 = 0;
      pBVar1 = (srp->out_link_).neighbors_.
               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
               super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(srp->out_link_).neighbors_.
                                  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >> 3);
      lVar2 = lVar2 + 1) {
    local_50 = pBVar1[lVar2];
    bb = std::
         map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
         ::operator[](&(srp->super_Proxy).outgoing_,&local_50);
    diy::Serialization<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::save
              (&bb->super_BinaryBuffer,(Vector *)&local_48);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void add_histogram(void* b_, const diy::ReduceProxy& srp)
{
    Histogram histogram;
    receive_histogram(b_, srp, histogram);

    for (int i = 0; i < srp.out_link().size(); ++i)
        srp.enqueue(srp.out_link().target(i), histogram);
}